

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O3

void __thiscall Symbol::Symbol(Symbol *this,string *str)

{
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Symbol_00109c70;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  return;
}

Assistant:

Symbol::Symbol(const std::string &str) {
    name = str;
}